

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

Vec_Wec_t * Abc_NtkDetectFinClasses(Abc_Ntk_t *pNtk,int fVerbose)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Vec_Wec_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Vec_Wec_t *p_03;
  Vec_Int_t *pVVar5;
  Vec_Int_t *vCos;
  uint uVar6;
  uint i;
  int i_00;
  int fReverse;
  char *__format;
  int iVar7;
  Vec_Int_t *local_98;
  Vec_Int_t *vTypes;
  Vec_Int_t *local_68;
  Vec_Wec_t *local_60;
  Vec_Int_t *local_58;
  Abc_Ntk_t *local_50;
  Vec_Int_t *local_48;
  Vec_Wec_t *vCoSets;
  Vec_Wec_t *vMap;
  
  vTypes = (Vec_Int_t *)0x0;
  if (pNtk->vFins == (Vec_Int_t *)0x0) {
    puts("Current network does not have the required info.");
    return (Vec_Wec_t *)0x0;
  }
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    if (pNtk->ntkType != ABC_NTK_LOGIC) goto LAB_0027282e;
    iVar1 = Abc_NtkFinCheckTypesOk2(pNtk);
    if (iVar1 == 0) {
      local_98 = (Vec_Int_t *)0x0;
      goto LAB_00272613;
    }
    pAVar3 = Abc_NtkObj(pNtk,iVar1);
    pcVar4 = Abc_ObjName(pAVar3);
    __format = 
    "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n"
    ;
  }
  else {
    if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
LAB_0027282e:
      __assert_fail("Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x47d,"Vec_Wec_t *Abc_NtkDetectFinClasses(Abc_Ntk_t *, int)");
    }
    iVar1 = Abc_NtkFinCheckTypesOk(pNtk);
    if (iVar1 == 0) {
      local_98 = Abc_NtkFinComputeTypes(pNtk);
      vTypes = local_98;
LAB_00272613:
      local_58 = pNtk->vFins;
      local_68 = Abc_NtkFinComputeObjects(local_58,&vMap,pNtk->vObjs->nSize);
      p = Abc_NtkDetectObjClasses(pNtk,local_68,&vCoSets);
      p_00 = Vec_IntAlloc(1000);
      p_01 = Vec_IntAlloc(1000);
      local_50 = pNtk;
      p_02 = Vec_WecStart(pNtk->vObjs->nSize);
      p_03 = Vec_WecAlloc(1000);
      uVar6 = p->nSize;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      local_60 = p_03;
      for (i = 0; uVar6 != i; i = i + 1) {
        pVVar5 = Vec_WecEntry(p,i);
        vCos = Vec_WecEntry(vCoSets,i);
        pNtk_00 = local_50;
        Abc_NtkFinMiterCollect(local_50,vCos,p_00,p_01);
        local_48 = pVVar5;
        pVVar5 = Abc_NtkFinCreateList(vMap,pVVar5);
        p_03 = local_60;
        uVar2 = Abc_NtkFinRefinement(pNtk_00,local_98,vCos,p_00,p_01,local_58,pVVar5,p_02,local_60);
        if (fVerbose != 0) {
          printf("Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n"
                 ,(ulong)i,(ulong)(uint)local_48->nSize,(ulong)(uint)pVVar5->nSize,
                 (ulong)(uint)p_00->nSize,(ulong)(uint)vCos->nSize,(ulong)(uint)p_01->nSize,
                 (ulong)uVar2);
        }
        Vec_IntFree(pVVar5);
      }
      iVar1 = p_03->nSize;
      i_00 = 0;
      iVar7 = 0;
      if (0 < iVar1) {
        iVar7 = iVar1;
      }
      for (; iVar7 != i_00; i_00 = i_00 + 1) {
        fReverse = i_00;
        pVVar5 = Vec_WecEntry(p_03,i_00);
        Vec_IntSort(pVVar5,fReverse);
      }
      qsort(p_03->pArray,(long)iVar1,0x10,Vec_WecSortCompare3);
      Vec_IntFreeP(&vTypes);
      Vec_IntFree(local_68);
      Vec_WecFree(p);
      Vec_WecFree(vMap);
      Vec_WecFree(p_02);
      Vec_WecFree(vCoSets);
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      return p_03;
    }
    pAVar3 = Abc_NtkObj(pNtk,iVar1);
    pcVar4 = Abc_ObjName(pAVar3);
    __format = "Current network contains unsupported gate types (for example, see node \"%s\").\n";
  }
  printf(__format,pcVar4);
  return (Vec_Wec_t *)0x0;
}

Assistant:

Vec_Wec_t * Abc_NtkDetectFinClasses( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTypes = NULL; // gate types
    Vec_Int_t * vPairs;        // original info as a set of pairs (ObjId, TypeId)
    Vec_Int_t * vObjs;         // all those objects that have some fin 
    Vec_Wec_t * vMap;          // for each object, the set of fins
    Vec_Wec_t * vMap2;         // for each local object, the set of pairs (Info, Index)
    Vec_Wec_t * vClasses;      // classes of objects
    Vec_Wec_t * vCoSets;       // corresponding CO sets
    Vec_Int_t * vClass;        // one class
    Vec_Int_t * vCoSet;        // one set of COs
    Vec_Int_t * vCiSet;        // one set of CIs
    Vec_Int_t * vNodeSet;      // one set of nodes
    Vec_Int_t * vList;         // one info list
    Vec_Wec_t * vResult;       // resulting equivalences
    int i, iObj, nCalls;
    if ( pNtk->vFins == NULL )
    {
        printf( "Current network does not have the required info.\n" );
        return NULL;
    }
    assert( Abc_NtkIsSopLogic(pNtk) || Abc_NtkIsMappedLogic(pNtk) );
    if ( Abc_NtkIsSopLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk(pNtk);
        if ( iObj )
        {
            printf( "Current network contains unsupported gate types (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
        vTypes   = Abc_NtkFinComputeTypes( pNtk );
    }
    else if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        iObj = Abc_NtkFinCheckTypesOk2(pNtk);
        if ( iObj )
        {
            printf( "Current network has mismatch between mapped gate size and fault gate size (for example, see node \"%s\").\n", Abc_ObjName(Abc_NtkObj(pNtk, iObj)) );
            return NULL;
        }
    }
    else assert( 0 );
    //Abc_NtkFrameExtend( pNtk );
    // collect data
    vPairs   = pNtk->vFins;
    vObjs    = Abc_NtkFinComputeObjects( vPairs, &vMap, Abc_NtkObjNumMax(pNtk) );
    vClasses = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCoSets );
    // refine classes
    vCiSet   = Vec_IntAlloc( 1000 );
    vNodeSet = Vec_IntAlloc( 1000 );
    vMap2    = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    vResult  = Vec_WecAlloc( 1000 );
    Vec_WecForEachLevel( vClasses, vClass, i )
    {
        // extract one window
        vCoSet = Vec_WecEntry( vCoSets, i );
        Abc_NtkFinMiterCollect( pNtk, vCoSet, vCiSet, vNodeSet );
        // refine one class
        vList = Abc_NtkFinCreateList( vMap, vClass );
        nCalls = Abc_NtkFinRefinement( pNtk, vTypes, vCoSet, vCiSet, vNodeSet, vPairs, vList, vMap2, vResult );
        if ( fVerbose )
            printf( "Group %4d :  Obj =%4d. Fins =%4d.  CI =%5d. CO =%5d. Node =%6d.  SAT calls =%5d.\n", 
                i, Vec_IntSize(vClass), Vec_IntSize(vList), Vec_IntSize(vCiSet), Vec_IntSize(vCoSet), Vec_IntSize(vNodeSet), nCalls );
        Vec_IntFree( vList );
    }
    // sort entries in each array
    Vec_WecForEachLevel( vResult, vClass, i )
        Vec_IntSort( vClass, 0 );
    // sort by the index of the first entry
    Vec_WecSortByFirstInt( vResult, 0 ); 
    // cleanup
    Vec_IntFreeP( & vTypes );
    Vec_IntFree( vObjs );
    Vec_WecFree( vClasses );
    Vec_WecFree( vMap );
    Vec_WecFree( vMap2 );
    Vec_WecFree( vCoSets );
    Vec_IntFree( vCiSet );
    Vec_IntFree( vNodeSet );
    return vResult;
}